

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toktx.cc
# Opt level: O1

void __thiscall toktxApp::validateOptions(toktxApp *this)

{
  string *psVar1;
  int iVar2;
  uint uVar3;
  size_type sVar4;
  pointer pcVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  const_iterator cVar10;
  ostream *poVar11;
  char *in_RSI;
  toktxApp *ptVar12;
  size_type sVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  undefined1 uStack_27f;
  undefined1 uStack_27e;
  undefined1 uStack_27d;
  _khr_df_primaries_e a_Stack_27c [13];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  pStack_248;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  pStack_220;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  pStack_1f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  pStack_1d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  pStack_1a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  pStack_180;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  pStack_158;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  pStack_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  pStack_108;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  pStack_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  pStack_b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  pStack_90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  pStack_68;
  toktxApp *ptStack_40;
  
  scApp::validateOptions(&this->super_scApp);
  iVar7 = (this->options).automipmap;
  iVar2 = (this->options).genmipmap;
  if (iVar2 + iVar7 + (this->options).mipmap < 2) {
    if ((iVar2 != 0 || iVar7 != 0) && (1 < (this->options).levels)) goto LAB_00111c51;
    if (((this->options).cubemap != 0) && ((this->options).lower_left_maps_to_s0t0 != 0)) {
      in_RSI = 
      "cubemaps require images to have an upper-left origin. Ignoring --lower_left_maps_to_s0t0.";
      ktxApp::error((ktxApp *)this,
                    "cubemaps require images to have an upper-left origin. Ignoring --lower_left_maps_to_s0t0."
                   );
      (this->options).lower_left_maps_to_s0t0 = 0;
    }
    uVar3 = (this->options).depth;
    if (uVar3 != 0 && (this->options).cubemap != 0) goto LAB_00111c59;
    if ((this->options).layers != 0 && uVar3 != 0) goto LAB_00111c61;
    bVar6 = (this->options).scale == 1.0;
    iVar7 = (this->options).resize;
    in_RSI = (char *)CONCAT71((int7)((ulong)in_RSI >> 8),iVar7 == 0 || bVar6);
    if (iVar7 != 0 && !bVar6) goto LAB_00111c69;
    if ((iVar7 != 0) && ((this->options).mipmap != 0)) goto LAB_00111c71;
    if ((uVar3 < 2) || ((this->options).genmipmap == 0)) {
      psVar1 = &(this->options).super_commandOptions.super_commandOptions.outfile;
      in_RSI = "-";
      iVar7 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar7 != 0) {
        in_RSI = (char *)0x2e;
        lVar8 = std::__cxx11::string::rfind((char)psVar1,0x2e);
        if (lVar8 == -1) {
          in_RSI = ".ktx2";
          if (*(int *)&(this->options).super_commandOptions.super_commandOptions.field_0x44 == 0) {
            in_RSI = ".ktx";
          }
          std::__cxx11::string::append((char *)psVar1);
        }
      }
      uVar9 = 6;
      if ((this->options).cubemap == 0) {
        uVar9 = (ulong)(this->options).levels;
      }
      if (uVar9 <= (ulong)((long)*(pointer *)
                                  ((long)&(this->options).super_commandOptions.super_commandOptions.
                                          infiles.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data + 8) -
                           (long)(this->options).super_commandOptions.super_commandOptions.infiles.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        return;
      }
      goto LAB_00111c81;
    }
  }
  else {
    validateOptions(this);
LAB_00111c51:
    validateOptions(this);
LAB_00111c59:
    validateOptions(this);
LAB_00111c61:
    validateOptions(this);
LAB_00111c69:
    validateOptions(this);
LAB_00111c71:
    validateOptions(this);
  }
  validateOptions(this);
LAB_00111c81:
  ptVar12 = this;
  validateOptions(this);
  ptStack_40 = this;
  if ((parseColorPrimaries(std::__cxx11::string&)::values_abi_cxx11_ == '\0') &&
     (iVar7 = __cxa_guard_acquire(&parseColorPrimaries(std::__cxx11::string&)::values_abi_cxx11_),
     iVar7 != 0)) {
    a_Stack_27c[0xc] = 0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[5],__khr_df_primaries_e,_true>
              (&pStack_248,(char (*) [5])"NONE",a_Stack_27c + 0xc);
    a_Stack_27c[0xb] = 1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[6],__khr_df_primaries_e,_true>
              (&pStack_220,(char (*) [6])"BT709",a_Stack_27c + 0xb);
    a_Stack_27c[10] = 1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[5],__khr_df_primaries_e,_true>
              (&pStack_1f8,(char (*) [5])"SRGB",a_Stack_27c + 10);
    a_Stack_27c[9] = 2;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[10],__khr_df_primaries_e,_true>
              (&pStack_1d0,(char (*) [10])"BT601-EBU",a_Stack_27c + 9);
    a_Stack_27c[8] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[12],__khr_df_primaries_e,_true>
              (&pStack_1a8,(char (*) [12])"BT601-SMPTE",a_Stack_27c + 8);
    a_Stack_27c[7] = 4;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[7],__khr_df_primaries_e,_true>
              (&pStack_180,(char (*) [7])"BT2020",a_Stack_27c + 7);
    a_Stack_27c[6] = 5;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[7],__khr_df_primaries_e,_true>
              (&pStack_158,(char (*) [7])"CIEXYZ",a_Stack_27c + 6);
    a_Stack_27c[5] = 6;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[5],__khr_df_primaries_e,_true>
              (&pStack_130,(char (*) [5])"ACES",a_Stack_27c + 5);
    a_Stack_27c[4] = 7;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[7],__khr_df_primaries_e,_true>
              (&pStack_108,(char (*) [7])"ACESCC",a_Stack_27c + 4);
    a_Stack_27c[3] = 8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[9],__khr_df_primaries_e,_true>
              (&pStack_e0,(char (*) [9])"NTSC1953",a_Stack_27c + 3);
    a_Stack_27c[2] = 9;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[7],__khr_df_primaries_e,_true>
              (&pStack_b8,(char (*) [7])"PAL525",a_Stack_27c + 2);
    a_Stack_27c[1] = 10;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[10],__khr_df_primaries_e,_true>
              (&pStack_90,(char (*) [10])"DISPLAYP3",a_Stack_27c + 1);
    a_Stack_27c[0] = KHR_DF_PRIMARIES_ADOBERGB;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[9],__khr_df_primaries_e,_true>
              (&pStack_68,(char (*) [9])"ADOBERGB",a_Stack_27c);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,_khr_df_primaries_e>,std::allocator<std::pair<std::__cxx11::string_const,_khr_df_primaries_e>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_Hashtable<std::pair<std::__cxx11::string_const,_khr_df_primaries_e>const*>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,_khr_df_primaries_e>,std::allocator<std::pair<std::__cxx11::string_const,_khr_df_primaries_e>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&parseColorPrimaries(std::__cxx11::string&)::values_abi_cxx11_,&pStack_248,
               &ptStack_40,0,&uStack_27d,&uStack_27e,&uStack_27f);
    lVar8 = -0x208;
    paVar14 = &pStack_68.first.field_2;
    do {
      if (paVar14 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar14->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar14->_M_allocated_capacity)[-2],
                        paVar14->_M_allocated_capacity + 1);
      }
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar14->_M_allocated_capacity + -5);
      lVar8 = lVar8 + 0x28;
    } while (lVar8 != 0);
    __cxa_atexit(std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>_>_>
                 ::~unordered_map,&parseColorPrimaries(std::__cxx11::string&)::values_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&parseColorPrimaries(std::__cxx11::string&)::values_abi_cxx11_);
  }
  sVar4 = ((key_type *)in_RSI)->_M_string_length;
  if (sVar4 != 0) {
    pcVar5 = (((key_type *)in_RSI)->_M_dataplus)._M_p;
    sVar13 = 0;
    do {
      iVar7 = toupper((int)pcVar5[sVar13]);
      pcVar5[sVar13] = (char)iVar7;
      sVar13 = sVar13 + 1;
    } while (sVar4 != sVar13);
    cVar10 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&parseColorPrimaries(std::__cxx11::string&)::values_abi_cxx11_._M_h,
                    (key_type *)in_RSI);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>,_true>
        ._M_cur == (__node_type *)0x0) {
      poVar11 = std::operator<<((ostream *)&std::cerr,
                                (string *)&(ptVar12->super_scApp).super_ktxApp.name);
      poVar11 = std::operator<<(poVar11,"Invalid or unsupported transfer function specified: ");
      poVar11 = std::operator<<(poVar11,(string *)in_RSI);
      std::endl<char,std::char_traits<char>>(poVar11);
      exit(1);
    }
  }
  return;
}

Assistant:

void
toktxApp::validateOptions()
{
    scApp::validateOptions();

    if (options.automipmap + options.genmipmap + options.mipmap > 1) {
        error("only one of --automipmap, --genmipmap and "
              "--mipmap may be specified.");
        usage();
        exit(1);
    }
    if ((options.automipmap || options.genmipmap) && options.levels > 1) {
        error("cannot specify --levels > 1 with --automipmap or --genmipmap.");
        usage();
        exit(1);
    }
    if (options.cubemap && options.lower_left_maps_to_s0t0) {
        error("cubemaps require images to have an upper-left origin. "
              "Ignoring --lower_left_maps_to_s0t0.");
        options.lower_left_maps_to_s0t0 = 0;
    }
    if (options.cubemap && options.depth > 0) {
        error("cubemaps cannot have 3D textures.");
        usage();
        exit(1);
    }
    if (options.layers && options.depth > 0) {
        error("cannot have 3D array textures.");
        usage();
        exit(1);
    }
    if (options.scale != 1.0 && options.resize) {
        error("only one of --scale and --resize can be specified.");
        usage();
        exit(1);
    }
    if (options.resize && options.mipmap) {
        error("only one of --resize and --mipmap can be specified.");
        usage();
        exit(1);
    }

    if (options.depth > 1 && options.genmipmap) {
        error("generation of mipmaps for 3d textures is not supported.\n"
              "A PR to add this feature will be gratefully accepted!");
        exit(1);
    }

    if (options.outfile.compare("-") != 0
            && options.outfile.find_last_of('.') == string::npos)
    {
        options.outfile.append(options.ktx2 ? ".ktx2" : ".ktx");
    }

    ktx_uint32_t requiredInputFiles = options.cubemap ? 6 : 1 * options.levels;
    if (requiredInputFiles > options.infiles.size()) {
        error("too few input files.");
        exit(1);
    }
    /* Whether there are enough input files for all the mipmap levels in
     * a full pyramid can only be checked when the first file has been
     * read and the size determined.
     */
}